

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditIconButton::startOpacityAnimation(QLineEditIconButton *this,qreal endValue)

{
  QPropertyAnimation *this_00;
  undefined4 *puVar1;
  long in_FS_OFFSET;
  code *local_70;
  ImplFn local_68;
  QObject local_60 [8];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QPropertyAnimation *)operator_new(0x10);
  local_58._0_8_ = (QArrayData *)0x0;
  local_58._8_8_ = "opacity";
  local_58._16_8_ = 7;
  QPropertyAnimation::QPropertyAnimation
            (this_00,(QObject *)this,(QByteArray *)local_58,(QObject *)this);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,1,0x10);
    }
  }
  local_70 = onAnimationFinished;
  local_68 = (ImplFn)0x0;
  local_58._0_8_ = QAbstractAnimation::finished;
  local_58._8_8_ = (char *)0x0;
  puVar1 = (undefined4 *)operator_new(0x20);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::QCallableObject<void_(QLineEditIconButton::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar1 + 4) = onAnimationFinished;
  *(undefined8 *)(puVar1 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)this_00,(QObject *)local_58,(void **)this,
             (QSlotObjectBase *)&local_70,(ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QVariantAnimation::setDuration((DeletionPolicy)this_00);
  ::QVariant::QVariant((QVariant *)local_58,endValue);
  QVariantAnimation::setEndValue((QVariant *)this_00);
  ::QVariant::~QVariant((QVariant *)local_58);
  QAbstractAnimation::start((DeletionPolicy)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::startOpacityAnimation(qreal endValue)
{
    QPropertyAnimation *animation = new QPropertyAnimation(this, QByteArrayLiteral("opacity"), this);
    connect(animation, &QPropertyAnimation::finished, this, &QLineEditIconButton::onAnimationFinished);

    animation->setDuration(160);
    animation->setEndValue(endValue);
    animation->start(QAbstractAnimation::DeleteWhenStopped);
}